

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O2

void swrenderer::R_3D_DeleteHeights(void)

{
  undefined8 *puVar1;
  
  puVar1 = &height_top;
  while (height_top = (void *)*puVar1, height_top != (void *)0x0) {
    height_cur = *(undefined8 *)((long)height_top + 0x10);
    M_Free(height_top);
    puVar1 = &height_cur;
  }
  height_max = 0xffffffff;
  height_cur = 0;
  height_top = (void *)0x0;
  return;
}

Assistant:

void R_3D_DeleteHeights()
{
	height_cur = height_top;
	while(height_cur) {
		height_top = height_cur;
		height_cur = height_cur->next;
		M_Free(height_top);
	}
	height_max = -1;
	height_top = height_cur = NULL;
}